

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O2

void __thiscall xray_re::xr_way_object::load(xr_way_object *this,xr_reader *r)

{
  uint16_t *puVar1;
  uint __line;
  undefined8 in_RAX;
  size_t sVar2;
  char *__assertion;
  uint16_t version;
  
  version = (uint16_t)((ulong)in_RAX >> 0x30);
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,1,&version);
  if (sVar2 == 0) {
    __assertion = "0";
    __line = 0x1c;
  }
  else if (version == 0x13) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar2 = xr_reader::find_chunk(r,2);
    if (sVar2 == 0) {
      __assertion = "0";
      __line = 0x22;
    }
    else {
      puVar1 = (r->field_2).m_p_u16;
      (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_reader::
      r_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,read_point_le>
                (r,*puVar1,&this->m_points);
      sVar2 = xr_reader::find_chunk(r,3);
      if (sVar2 != 0) {
        puVar1 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
        xr_reader::
        r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
                  (r,*puVar1,&this->m_links);
        xr_reader::r_chunk<unsigned_int>(r,4,&this->m_type);
        return;
      }
      __assertion = "0";
      __line = 0x27;
    }
  }
  else {
    __assertion = "version == WAYOBJECT_VERSION";
    __line = 0x1d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                ,__line,"virtual void xray_re::xr_way_object::load(xr_reader &)");
}

Assistant:

void xr_way_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WAYOBJECT_VERSION);

	xr_custom_object::load(r);

	if (!r.find_chunk(WAYOBJECT_CHUNK_POINTS))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_points, read_point_le());
	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_LINKS))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_links, way_link_io());
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(WAYOBJECT_CHUNK_TYPE, m_type);
}